

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnFunctionName
          (BinaryReaderIR *this,Index index,string_view name)

{
  Module *pMVar1;
  pointer ppFVar2;
  string_view name_00;
  string *orig_name;
  Enum EVar3;
  size_t in_stack_ffffffffffffff78;
  Func *pFVar4;
  string dollar_name;
  __buckets_ptr local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  float local_38;
  
  orig_name = (string *)name._M_str;
  EVar3 = Ok;
  if (name._M_len != 0) {
    pMVar1 = this->module_;
    ppFVar2 = (pMVar1->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)index <
        (ulong)((long)(pMVar1->funcs).
                      super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3)) {
      pFVar4 = ppFVar2[index];
      name_00._M_str = (char *)pFVar4;
      name_00._M_len = in_stack_ffffffffffffff78;
      (anonymous_namespace)::MakeDollarName_abi_cxx11_(name_00);
      GetUniqueName(&dollar_name,(BinaryReaderIR *)&pMVar1->func_bindings,(BindingHash *)&local_58,
                    orig_name);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_assign((string *)pFVar4);
      uStack_48 = 0;
      uStack_44 = 0;
      local_58 = (__buckets_ptr)0x0;
      uStack_50 = 0;
      uStack_4c = 0;
      local_38 = (float)index;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                  *)&this->module_->func_bindings,&dollar_name,&local_58);
      std::__cxx11::string::_M_dispose();
    }
    else {
      PrintError(this,"invalid function index: %u",index);
      EVar3 = Error;
    }
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderIR::OnFunctionName(Index index, std::string_view name) {
  return SetFunctionName(index, name);
}